

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concur19.cc
# Opt level: O0

void __thiscall
tchecker::tck_reach::concur19::graph_t::graph_t
          (graph_t *this,shared_ptr<tchecker::refzg::refzg_t> *refzg,size_t block_size,
          size_t table_size)

{
  int iVar1;
  element_type *this_00;
  undefined4 extraout_var;
  node_le_t local_50;
  node_hash_t local_29;
  size_t local_28;
  size_t table_size_local;
  size_t block_size_local;
  shared_ptr<tchecker::refzg::refzg_t> *refzg_local;
  graph_t *this_local;
  
  local_28 = table_size;
  table_size_local = block_size;
  block_size_local = (size_t)refzg;
  refzg_local = (shared_ptr<tchecker::refzg::refzg_t> *)this;
  this_00 = std::
            __shared_ptr_access<tchecker::refzg::refzg_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<tchecker::refzg::refzg_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)refzg);
  iVar1 = tchecker::refzg::refzg_t::system(this_00,(char *)refzg);
  node_le_t::node_le_t(&local_50,(system_t *)CONCAT44(extraout_var,iVar1));
  tchecker::graph::subsumption::
  graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>
  ::graph_t(&this->
             super_graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>
            ,block_size,table_size,&local_29,&local_50);
  node_le_t::~node_le_t(&local_50);
  (this->
  super_graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>
  )._vptr_graph_t = (_func_int **)&PTR__graph_t_004803e0;
  std::shared_ptr<tchecker::refzg::refzg_t>::shared_ptr
            (&this->_refzg,(shared_ptr<tchecker::refzg::refzg_t> *)block_size_local);
  return;
}

Assistant:

graph_t::graph_t(std::shared_ptr<tchecker::refzg::refzg_t> const & refzg, std::size_t block_size, std::size_t table_size)
    : tchecker::graph::subsumption::graph_t<tchecker::tck_reach::concur19::node_t, tchecker::tck_reach::concur19::edge_t,
                                            tchecker::tck_reach::concur19::node_hash_t,
                                            tchecker::tck_reach::concur19::node_le_t>(
          block_size, table_size, tchecker::tck_reach::concur19::node_hash_t(),
          tchecker::tck_reach::concur19::node_le_t(refzg->system())),
      _refzg(refzg)
{
}